

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_mixer_chain.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  ALLEGRO_SAMPLE_INSTANCE *sample [2];
  ALLEGRO_MIXER *submixer [2];
  ALLEGRO_SAMPLE *sample_data [2];
  long local_68 [7];
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') goto LAB_001026c2;
  if (argc < 3) {
    log_printf("This example needs to be run from the command line.\nUsage: %s file1 file2\n",*argv)
    ;
    return 0;
  }
  al_init_acodec_addon();
  cVar1 = al_install_audio();
  if (cVar1 == '\0') {
    pcVar7 = "Could not init sound!\n";
  }
  else {
    lVar2 = al_create_voice(0xac44,1,0x20);
    if (lVar2 == 0) {
      pcVar7 = "Could not create ALLEGRO_VOICE.\n";
    }
    else {
      lVar3 = al_create_mixer(0xac44,3,0x20);
      lVar4 = al_create_mixer(0xac44,3,0x20);
      local_68[2] = lVar4;
      local_68[3] = al_create_mixer(0xac44,3,0x20);
      if (((lVar3 == 0) || (lVar4 == 0)) || (local_68[3] == 0)) {
        pcVar7 = "al_create_mixer failed.\n";
      }
      else {
        cVar1 = al_attach_mixer_to_voice(lVar3,lVar2);
        if (cVar1 == '\0') {
          pcVar7 = "al_attach_mixer_to_voice failed.\n";
        }
        else {
          lVar4 = 0;
          do {
            if (lVar4 == 2) {
              lVar4 = 0;
              do {
                lVar5 = local_68[lVar4];
                al_set_sample_instance_playmode(lVar5,0x101);
                al_play_sample_instance(lVar5);
                lVar4 = lVar4 + 1;
              } while (lVar4 == 1);
              fVar8 = (float)al_get_sample_instance_time(local_68[0]);
              fVar9 = (float)al_get_sample_instance_time(local_68[1]);
              if (fVar9 <= fVar8) {
                fVar9 = fVar8;
              }
              lVar4 = 0;
              log_printf("Playing...");
              al_rest();
              al_set_sample_instance_gain(0x3f000000,local_68[0]);
              al_rest((double)fVar9);
              al_set_sample_instance_gain(0x3e800000,local_68[1]);
              al_rest((double)fVar9);
              al_stop_sample_instance(local_68[0]);
              al_stop_sample_instance(local_68[1]);
              log_printf("Done\n");
              do {
                lVar5 = local_68[lVar4];
                al_set_sample(lVar5,0);
                al_destroy_sample(local_68[lVar4 + 4]);
                al_destroy_sample_instance(lVar5);
                al_destroy_mixer(local_68[lVar4 + 2]);
                lVar4 = lVar4 + 1;
              } while (lVar4 == 1);
              al_destroy_mixer(lVar3);
              al_destroy_voice(lVar2);
              al_uninstall_audio();
              return 0;
            }
            pcVar7 = argv[lVar4 + 1];
            lVar5 = al_load_sample(pcVar7);
            local_68[lVar4 + 4] = lVar5;
            if (lVar5 == 0) {
              abort_example("Could not load sample from \'%s\'!\n",pcVar7);
LAB_001026ab:
              pcVar7 = "al_create_sample failed.\n";
              goto LAB_001026bb;
            }
            lVar6 = al_create_sample_instance(0);
            local_68[lVar4] = lVar6;
            if (lVar6 == 0) goto LAB_001026ab;
            cVar1 = al_set_sample(lVar6,lVar5);
            if (cVar1 == '\0') {
              pcVar7 = "al_set_sample_ptr failed.\n";
              goto LAB_001026bb;
            }
            lVar5 = local_68[lVar4 + 2];
            cVar1 = al_attach_sample_instance_to_mixer(lVar6,lVar5);
            if (cVar1 == '\0') {
              pcVar7 = "al_attach_sample_instance_to_mixer failed.\n";
              goto LAB_001026bb;
            }
            cVar1 = al_attach_mixer_to_mixer(lVar5,lVar3);
            lVar4 = lVar4 + 1;
          } while (cVar1 != '\0');
          pcVar7 = "al_attach_mixer_to_mixer failed.\n";
        }
      }
    }
  }
LAB_001026bb:
  do {
    abort_example(pcVar7);
LAB_001026c2:
    pcVar7 = "Could not init Allegro.\n";
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_VOICE *voice;
   ALLEGRO_MIXER *mixer;
   ALLEGRO_MIXER *submixer[2];
   ALLEGRO_SAMPLE_INSTANCE *sample[2];
   ALLEGRO_SAMPLE *sample_data[2];
   float sample_time;
   float max_sample_time;
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 3) {
      log_printf("This example needs to be run from the command line.\nUsage: %s file1 file2\n", argv[0]);
      goto done;
   }

   al_init_acodec_addon();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
      ALLEGRO_CHANNEL_CONF_2);
   if (!voice) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
   }

   mixer = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   submixer[0] = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   submixer[1] = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   if (!mixer || !submixer[0] || !submixer[1]) {
      abort_example("al_create_mixer failed.\n");
   }

   if (!al_attach_mixer_to_voice(mixer, voice)) {
      abort_example("al_attach_mixer_to_voice failed.\n");
   }

   for (i = 0; i < 2; i++) {
      const char *filename = argv[i + 1];
      sample_data[i] = al_load_sample(filename);
      if (!sample_data[i]) {
         abort_example("Could not load sample from '%s'!\n", filename);
      }
      sample[i] = al_create_sample_instance(NULL);
      if (!sample[i]) {
         abort_example("al_create_sample failed.\n");
      }
      if (!al_set_sample(sample[i], sample_data[i])) {
         abort_example("al_set_sample_ptr failed.\n");
      }
      if (!al_attach_sample_instance_to_mixer(sample[i], submixer[i])) {
         abort_example("al_attach_sample_instance_to_mixer failed.\n");
      }
      if (!al_attach_mixer_to_mixer(submixer[i], mixer)) {
         abort_example("al_attach_mixer_to_mixer failed.\n");
      }
   }

   /* Play sample in looping mode. */
   for (i = 0; i < 2; i++) {
      al_set_sample_instance_playmode(sample[i], ALLEGRO_PLAYMODE_LOOP);
      al_play_sample_instance(sample[i]);
   }

   max_sample_time = al_get_sample_instance_time(sample[0]);
   sample_time = al_get_sample_instance_time(sample[1]);
   if (sample_time > max_sample_time)
      max_sample_time = sample_time;

   log_printf("Playing...");

   al_rest(max_sample_time);

   al_set_sample_instance_gain(sample[0], 0.5);
   al_rest(max_sample_time);

   al_set_sample_instance_gain(sample[1], 0.25);
   al_rest(max_sample_time);

   al_stop_sample_instance(sample[0]);
   al_stop_sample_instance(sample[1]);
   log_printf("Done\n");

   /* Free the memory allocated. */
   for (i = 0; i < 2; i++) {
      al_set_sample(sample[i], NULL);
      al_destroy_sample(sample_data[i]);
      al_destroy_sample_instance(sample[i]);
      al_destroy_mixer(submixer[i]);
   }
   al_destroy_mixer(mixer);
   al_destroy_voice(voice);

   al_uninstall_audio();

done:
   close_log(true);

   return 0;
}